

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O0

void __thiscall boost::thread::~thread(thread *this)

{
  detach(this);
  shared_ptr<boost::detail::thread_data_base>::~shared_ptr
            ((shared_ptr<boost::detail::thread_data_base> *)0x27ed84);
  return;
}

Assistant:

~thread()
        {

    #if defined BOOST_THREAD_PROVIDES_THREAD_DESTRUCTOR_CALLS_TERMINATE_IF_JOINABLE
          if (joinable()) {
            std::terminate();
          }
    #else
            detach();
    #endif
        }